

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_next_on_map(uint32_t count)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  long k;
  char *d3;
  char *d2;
  byte *local_40;
  char *local_38;
  
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"next/check on map(%u)",count);
  fputc(10,_stdout);
  if (count < 0x10) {
    buf[1] = (byte)count | 0x80;
    pcVar7 = buf + 2;
  }
  else if (count < 0x10000) {
    buf[1] = -0x22;
    uVar2 = (ushort)count << 8 | (ushort)count >> 8;
    buf[2] = (char)uVar2;
    buf[3] = (char)(uVar2 >> 8);
    pcVar7 = buf + 4;
  }
  else {
    buf[1] = -0x21;
    buf._2_4_ = count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
    pcVar7 = buf + 6;
  }
  iVar3 = count * 2;
  if (iVar3 != 0) {
    uVar4 = 0;
    iVar6 = iVar3;
    do {
      iVar8 = (int)(uVar4 * 0x2040811 >> 0x20);
      uVar9 = ((uint)((int)uVar4 - iVar8) >> 1) + iVar8 >> 6;
      *pcVar7 = (char)uVar4 - ((char)(uVar9 << 7) - (char)uVar9);
      pcVar7 = pcVar7 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  iVar6 = 1;
  if (0xf < count) {
    iVar6 = (0xffff < count) + 3 + (uint)(0xffff < count);
  }
  uVar9 = iVar6 + iVar3;
  pbVar10 = (byte *)(ulong)uVar9;
  local_38 = buf + 1;
  local_40 = (byte *)(buf + 1);
  iVar3 = mp_check(&local_38,str);
  _ok((uint)(iVar3 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d4,
      "mp_check(map %u))",count);
  _ok((uint)((byte *)(pcVar7 + -0x154121) == pbVar10),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d5,
      "len(map %u) == %u",count,uVar9);
  _ok((uint)((byte *)(local_38 + -0x154121) == pbVar10),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d6,
      "len(mp_check(map %u)) == %u",count,uVar9);
  k = 1;
  do {
    lVar5 = (long)""[*local_40];
    if (lVar5 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_0012eb62;
      }
      if (-0x20 < ""[*local_40]) {
        k = k - lVar5;
        local_40 = local_40 + 1;
        goto LAB_0012eb62;
      }
      mp_next_slowpath((char **)&local_40,k);
      bVar1 = false;
      lVar5 = k;
    }
    else {
      local_40 = local_40 + 1 + lVar5;
LAB_0012eb62:
      bVar1 = true;
      lVar5 = k;
    }
    if ((!bVar1) || (k = lVar5 + -1, lVar5 < 2)) {
      _ok((uint)(local_40 + -0x154121 == pbVar10),"(d3 - data) == (ptrdiff_t)len",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x2d8,"len(mp_next(map %u)) == %u",count,uVar9);
      return;
    }
  } while( true );
}

Assistant:

static void
test_next_on_map(uint32_t count)
{
	note("next/check on map(%u)", count);
	char *d1 = data;
	d1 = mp_encode_map(d1, count);
	for (uint32_t i = 0; i < 2 * count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = 2 * count + mp_sizeof_map(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(map %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(map %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(map %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(map %u)) == %u", count, len);
}